

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

gs_expr_t * gs_parse_expr_comparison(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  gs_token_t *pgVar2;
  anon_union_8_5_f029217d_for_gs_token_3 aVar3;
  anon_union_8_5_f029217d_for_gs_token_3 aVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  gs_token_type gVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  _Bool _Var12;
  byte bVar13;
  gs_expr_t *pgVar14;
  gs_expr_t *pgVar15;
  gs_expr_t *pgVar16;
  int iVar17;
  undefined8 in_RSI;
  gs_token_t token;
  
  pgVar2 = (parser->tokens).data;
  iVar17 = parser->cur_token;
  aVar3 = pgVar2[iVar17].field_3;
  pgVar1 = pgVar2 + iVar17;
  uVar5 = pgVar1->type;
  uVar6 = pgVar1->line;
  uVar7 = *(undefined8 *)&pgVar1->col;
  pgVar1 = pgVar2 + iVar17;
  gVar8 = pgVar1->type;
  iVar9 = pgVar1->line;
  iVar10 = pgVar1->col;
  uVar11 = *(undefined4 *)&pgVar1->field_0xc;
  aVar4 = pgVar2[iVar17].field_3;
  pgVar14 = gs_parse_expr_factor(parser);
  bVar13 = parser->error;
  if ((_Bool)bVar13 != false) {
LAB_001370a8:
    if ((bVar13 & 1) != 0) {
      return pgVar14;
    }
    do {
      iVar17 = (int)in_RSI;
      _Var12 = gs_eat_char_n(parser,iVar17,0x3d,0x3d);
      if (_Var12) {
        pgVar15 = gs_parse_expr_comparison(parser);
        if (parser->error != false) {
          return pgVar14;
        }
        iVar17 = 8;
      }
      else {
        _Var12 = gs_eat_char_n(parser,iVar17,0x3c,0x3d);
        if (_Var12) {
          pgVar15 = gs_parse_expr_comparison(parser);
          if (parser->error != false) {
            return pgVar14;
          }
          iVar17 = 6;
        }
        else {
          _Var12 = gs_eat_char_n(parser,iVar17,0x3e,0x3d);
          if (_Var12) {
            pgVar15 = gs_parse_expr_comparison(parser);
            if (parser->error != false) {
              return pgVar14;
            }
            iVar17 = 7;
          }
          else {
            _Var12 = gs_eat_char(parser,'>');
            if (_Var12) {
              pgVar15 = gs_parse_expr_comparison(parser);
              if (parser->error != false) {
                return pgVar14;
              }
              iVar17 = 5;
            }
            else {
              _Var12 = gs_eat_char(parser,'<');
              if (!_Var12) {
                return pgVar14;
              }
              pgVar15 = gs_parse_expr_comparison(parser);
              if (parser->error != false) {
                return pgVar14;
              }
              iVar17 = 4;
            }
          }
        }
      }
      in_RSI = 0x40;
      pgVar16 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
      pgVar16->type = GS_EXPR_BINARY_OP;
      token.col = (int)uVar7;
      token._12_4_ = SUB84((ulong)uVar7 >> 0x20,0);
      (pgVar16->token).type = uVar5;
      (pgVar16->token).line = uVar6;
      (pgVar16->token).col = token.col;
      *(undefined4 *)&(pgVar16->token).field_0xc = token._12_4_;
      (pgVar16->token).field_3 = aVar3;
      (pgVar16->field_2).int_val = iVar17;
      (pgVar16->field_2).binary_op.left = pgVar14;
      (pgVar16->field_2).binary_op.right = pgVar15;
      pgVar14 = pgVar16;
    } while( true );
  }
  do {
    in_RSI = 0x2b;
    _Var12 = gs_eat_char(parser,'+');
    iVar17 = 0;
    if (!_Var12) {
      in_RSI = 0x2d;
      _Var12 = gs_eat_char(parser,'-');
      iVar17 = 1;
      if (!_Var12) {
        bVar13 = parser->error;
        goto LAB_001370a8;
      }
    }
    pgVar15 = gs_parse_expr_factor(parser);
    bVar13 = parser->error;
    if ((_Bool)bVar13 != false) goto LAB_001370a8;
    pgVar16 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
    pgVar16->type = GS_EXPR_BINARY_OP;
    (pgVar16->token).type = gVar8;
    (pgVar16->token).line = iVar9;
    (pgVar16->token).col = iVar10;
    *(undefined4 *)&(pgVar16->token).field_0xc = uVar11;
    (pgVar16->token).field_3 = aVar4;
    (pgVar16->field_2).int_val = iVar17;
    (pgVar16->field_2).binary_op.left = pgVar14;
    (pgVar16->field_2).binary_op.right = pgVar15;
    pgVar14 = pgVar16;
  } while( true );
}

Assistant:

static gs_expr_t *gs_parse_expr_comparison(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_term(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char_n(parser, 2, '=', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_EQ, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '<', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LTE, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '>', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GTE, expr, right);
        }
        else if (gs_eat_char(parser, '>')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GT, expr, right);
        }
        else if (gs_eat_char(parser, '<')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LT, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}